

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_>::flattenTo
          (Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_> *this,char *target)

{
  bool bVar1;
  long lVar2;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *elem;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *this_00;
  
  ensureStringifiedInitialized(this);
  this_00 = (this->stringified).ptr;
  bVar1 = true;
  for (lVar2 = (this->stringified).size_ * 0x38; lVar2 != 0; lVar2 = lVar2 + -0x38) {
    if (!bVar1) {
      target = fill<kj::StringPtr>(target,&this->delimiter);
    }
    target = Delimited<kj::ArrayPtr<const_unsigned_char>_>::flattenTo(this_00,target);
    this_00 = this_00 + 1;
    bVar1 = false;
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }